

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pr.cpp
# Opt level: O2

longlong tid_to_ll(id *tid)

{
  longlong lVar1;
  string local_30;
  
  tid_to_string_abi_cxx11_(&local_30,tid);
  lVar1 = atoll(local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return lVar1;
}

Assistant:

long long tid_to_ll(const thread::id& tid)
{
    return atoll(tid_to_string(tid).c_str());
}